

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReceiverPdu.cpp
# Opt level: O1

bool __thiscall DIS::ReceiverPdu::operator==(ReceiverPdu *this,ReceiverPdu *rhs)

{
  float fVar1;
  float fVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  bool bVar7;
  bool bVar8;
  
  bVar7 = RadioCommunicationsFamilyPdu::operator==
                    (&this->super_RadioCommunicationsFamilyPdu,
                     &rhs->super_RadioCommunicationsFamilyPdu);
  sVar3 = *(short *)&(this->super_RadioCommunicationsFamilyPdu).field_0x3a;
  sVar4 = *(short *)&(rhs->super_RadioCommunicationsFamilyPdu).field_0x3a;
  sVar5 = *(short *)&(rhs->super_RadioCommunicationsFamilyPdu).field_0x3c;
  sVar6 = *(short *)&(this->super_RadioCommunicationsFamilyPdu).field_0x3c;
  fVar1 = this->_receivedPower;
  fVar2 = rhs->_receivedPower;
  bVar8 = EntityID::operator==(&this->_transmitterEntityId,&rhs->_transmitterEntityId);
  return (((bVar8 && this->_transmitterRadioId == rhs->_transmitterRadioId) && sVar6 == sVar5) &&
         (bVar7 && sVar3 == sVar4)) && fVar1 == fVar2;
}

Assistant:

bool ReceiverPdu::operator ==(const ReceiverPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = RadioCommunicationsFamilyPdu::operator==(rhs);

     if( ! (_receiverState == rhs._receiverState) ) ivarsEqual = false;
     if( ! (_padding1 == rhs._padding1) ) ivarsEqual = false;
     if( ! (_receivedPower == rhs._receivedPower) ) ivarsEqual = false;
     if( ! (_transmitterEntityId == rhs._transmitterEntityId) ) ivarsEqual = false;
     if( ! (_transmitterRadioId == rhs._transmitterRadioId) ) ivarsEqual = false;

    return ivarsEqual;
 }